

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int64_t gmfopenmeshf77_(char *FilNam,int *mod,int *ver,int *dim,long StrSiz)

{
  ushort **ppuVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_430;
  char TmpNam [1024];
  
  if (0 < StrSiz) {
    uStack_430 = 0x10a8ea;
    ppuVar1 = __ctype_b_loc();
    lVar6 = StrSiz + 1;
    do {
      lVar5 = lVar6;
      lVar6 = lVar5 + -1;
    } while ((*(byte *)((long)*ppuVar1 + (long)FilNam[lVar5 + -2] * 2 + 1) & 0x20) != 0);
    lVar2 = 0;
    lVar4 = 0;
    if (0 < lVar6) {
      lVar4 = lVar6;
    }
    for (; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      TmpNam[lVar2] = FilNam[lVar2];
    }
    TmpNam[lVar5 + -1] = '\0';
    if (*mod == 1) {
      uStack_430 = 0x10a93f;
      iVar3 = GmfOpenMesh(TmpNam,1,ver,dim);
    }
    else {
      uStack_430 = 0x10a956;
      iVar3 = GmfOpenMesh(TmpNam,2,(ulong)(uint)*ver,(ulong)(uint)*dim);
    }
    return iVar3;
  }
  return 0;
}

Assistant:

int64_t APIF77(gmfopenmeshf77)(  char *FilNam, int *mod,
                                 int *ver, int *dim, long int StrSiz )
{
   int   i = 0;
   char  TmpNam[ GmfStrSiz ];

   if(StrSiz <= 0)
      return(0);

   // Trim trailing spaces from the fortran string
   while(isspace(FilNam[ StrSiz-1 ]))
      StrSiz--;

   for(i=0;i<StrSiz;i++)
      TmpNam[i] = FilNam[i];

   TmpNam[ StrSiz ] = 0;

   if(*mod == GmfRead)
      return(GmfOpenMesh(TmpNam, GmfRead, ver, dim));
   else
      return(GmfOpenMesh(TmpNam, GmfWrite, *ver, *dim));
}